

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O2

bool __thiscall
CriticalSectionsBuilder::buildCriticalSection(CriticalSectionsBuilder *this,LockNode *lock)

{
  bool bVar1;
  iterator iVar2;
  CriticalSection *this_00;
  CriticalSection *criticalSection;
  _Rb_tree<UnlockNode_*,_UnlockNode_*,_std::_Identity<UnlockNode_*>,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>
  local_60;
  
  local_60._M_impl._0_8_ = Node::callInstruction(&lock->super_Node);
  iVar2 = std::
          _Rb_tree<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_CriticalSection_*>,_std::_Select1st<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
          ::find(&(this->criticalSections_)._M_t,(key_type *)&local_60);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->criticalSections_)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (CriticalSection *)operator_new(0x38);
    CriticalSection::CriticalSection(this_00,lock);
    criticalSection = this_00;
    local_60._M_impl._0_8_ = Node::callInstruction(&lock->super_Node);
    std::
    _Rb_tree<llvm::CallInst_const*,std::pair<llvm::CallInst_const*const,CriticalSection*>,std::_Select1st<std::pair<llvm::CallInst_const*const,CriticalSection*>>,std::less<llvm::CallInst_const*>,std::allocator<std::pair<llvm::CallInst_const*const,CriticalSection*>>>
    ::_M_emplace_unique<llvm::CallInst_const*,CriticalSection*&>
              ((_Rb_tree<llvm::CallInst_const*,std::pair<llvm::CallInst_const*const,CriticalSection*>,std::_Select1st<std::pair<llvm::CallInst_const*const,CriticalSection*>>,std::less<llvm::CallInst_const*>,std::allocator<std::pair<llvm::CallInst_const*const,CriticalSection*>>>
                *)&this->criticalSections_,(CallInst **)&local_60,&criticalSection);
    this->currentLock = lock;
    LockNode::correspondingUnlocks
              ((set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_> *)
               &local_60,lock);
    std::
    _Rb_tree<UnlockNode_*,_UnlockNode_*,_std::_Identity<UnlockNode_*>,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>
    ::_M_move_assign(&(this->currentUnlocks)._M_t,&local_60);
    std::
    _Rb_tree<UnlockNode_*,_UnlockNode_*,_std::_Identity<UnlockNode_*>,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>
    ::~_Rb_tree(&local_60);
    visitNode(this,&lock->super_Node);
    bVar1 = populateCriticalSection(this);
    std::
    _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
    clear(&(this->examined_)._M_t);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CriticalSectionsBuilder::buildCriticalSection(LockNode *lock) {
    auto iterator = criticalSections_.find(lock->callInstruction());
    if (iterator != criticalSections_.end()) {
        return false;
    }

    auto *criticalSection = new CriticalSection(lock);
    criticalSections_.emplace(lock->callInstruction(), criticalSection);

    currentLock = lock;
    currentUnlocks = lock->correspondingUnlocks();
    visitNode(lock);
    bool changed = populateCriticalSection();
    examined_.clear();
    return changed;
}